

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::
argument_loader<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>&,unsigned_long_const&>
::load_impl_sequence<0ul,1ul>(void *param_1,long param_2)

{
  handle src;
  undefined1 uVar1;
  reference pvVar2;
  const_iterator pbVar3;
  const_iterator pbVar4;
  reference rVar5;
  bool r;
  const_iterator __end0;
  const_iterator __begin0;
  initializer_list<bool> *__range3;
  bool bStack000000000000008f;
  undefined8 in_stack_00000088;
  map_caster<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>,_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>
  *in_stack_00000090;
  handle in_stack_00000098;
  size_type in_stack_ffffffffffffff88;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff90;
  reference local_68;
  PyObject *local_58;
  undefined1 convert;
  PyObject *this;
  undefined6 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  initializer_list<bool> local_30;
  initializer_list<bool> *local_20;
  long local_18;
  void *local_10;
  
  bStack000000000000008f = SUB81((ulong)in_stack_00000088 >> 0x38,0);
  local_18 = param_2;
  local_10 = param_1;
  std::
  get<0ul,pybind11::detail::type_caster<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,void>,pybind11::detail::type_caster<unsigned_long,void>>
            ((tuple<pybind11::detail::type_caster<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>,_void>,_pybind11::detail::type_caster<unsigned_long,_void>_>
              *)0x3976a9);
  pvVar2 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),
                      0);
  this = pvVar2->m_ptr;
  rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                    (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  convert = rVar5._M_mask._7_1_;
  std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&stack0xffffffffffffffb0);
  uVar1 = map_caster<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>,_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>
          ::load(in_stack_00000090,in_stack_00000098,bStack000000000000008f);
  std::
  get<1ul,pybind11::detail::type_caster<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,void>,pybind11::detail::type_caster<unsigned_long,void>>
            ((tuple<pybind11::detail::type_caster<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>,_void>,_pybind11::detail::type_caster<unsigned_long,_void>_>
              *)0x397717);
  pvVar2 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),
                      1);
  local_58 = pvVar2->m_ptr;
  local_68 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::_Bit_reference::operator_cast_to_bool(&local_68);
  src.m_ptr._6_1_ = uVar1;
  src.m_ptr._0_6_ = in_stack_ffffffffffffffc8;
  src.m_ptr._7_1_ = in_stack_ffffffffffffffcf;
  type_caster<unsigned_long,_void>::load((type_caster<unsigned_long,_void> *)this,src,(bool)convert)
  ;
  local_30._M_array = (iterator)&stack0xffffffffffffffce;
  local_30._M_len = 2;
  local_20 = &local_30;
  pbVar3 = std::initializer_list<bool>::begin(local_20);
  pbVar4 = std::initializer_list<bool>::end((initializer_list<bool> *)param_1);
  while( true ) {
    if (pbVar3 == pbVar4) {
      return true;
    }
    if ((*pbVar3 & 1U) == 0) break;
    pbVar3 = pbVar3 + 1;
  }
  return false;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }